

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1031b3c::TargetCompileFeaturesImpl::HandleDirectContent
          (TargetCompileFeaturesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  pointer pbVar1;
  bool bVar2;
  pointer feature;
  string error;
  cmStandardLevelResolver standardResolver;
  string local_58;
  cmStandardLevelResolver local_38;
  
  local_38.Makefile = (this->super_cmTargetPropCommandBase).Makefile;
  feature = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (feature == pbVar1) {
LAB_003314c3:
      return feature == pbVar1;
    }
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    bVar2 = cmStandardLevelResolver::AddRequiredTargetFeature(&local_38,tgt,feature,&local_58);
    if (!bVar2) {
      cmTargetPropCommandBase::SetError(&this->super_cmTargetPropCommandBase,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_003314c3;
    }
    std::__cxx11::string::~string((string *)&local_58);
    feature = feature + 1;
  } while( true );
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    cmStandardLevelResolver standardResolver(this->Makefile);
    for (std::string const& it : content) {
      std::string error;
      if (!standardResolver.AddRequiredTargetFeature(tgt, it, &error)) {
        this->SetError(error);
        return false; // Not (successfully) handled.
      }
    }
    return true; // Successfully handled.
  }